

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmtable.cpp
# Opt level: O1

void __thiscall icu_63::Formattable::Formattable(Formattable *this,int64_t value)

{
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__Formattable_003e6888;
  (this->fBogus).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003f7be0;
  (this->fBogus).fUnion.fStackFields.fLengthAndFlags = 2;
  (this->fValue).fObject = (UObject *)0x0;
  this->fType = kLong;
  this->fDecimalStr = (CharString *)0x0;
  this->fDecimalQuantity = (DecimalQuantity *)0x0;
  UnicodeString::setToBogus(&this->fBogus);
  this->fType = kInt64;
  (this->fValue).fInt64 = value;
  return;
}

Assistant:

Formattable::Formattable(int64_t value)
{
    init();
    fType = kInt64;
    fValue.fInt64 = value;
}